

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O1

int __thiscall KParser::_var(KParser *this,int begin,BlockInfo bi)

{
  pointer pTVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [264];
  
  pTVar1 = (this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1[begin].tokenType == _var) {
    if (pTVar1[(long)begin + 1].tokenType == id) {
      if (pTVar1[(long)begin + 2].tokenType == semicolon) {
        return begin + 3;
      }
      sprintf(local_128,anon_var_dwarf_1664f,(ulong)(uint)pTVar1[(long)begin + 2].line);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      sVar2 = strlen(local_128);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,local_128,local_128 + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_148);
    }
    else {
      sprintf(local_128,anon_var_dwarf_16639,(ulong)(uint)pTVar1[(long)begin + 1].line);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      sVar2 = strlen(local_128);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,local_128,local_128 + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errorMsgs,&local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  return -1;
}

Assistant:

int KParser::_var(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;

    if (m_tokens[i].tokenType != TokenType::_var) {
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::id) {
        char buf[256];
        sprintf(buf, "line[%d]: 식별자가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: ; 가 빠졌습니다.\n", m_tokens[i].line);
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    return i;
}